

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O3

void ssh2_send_packet_from_downstream
               (ConnectionLayer *cl,uint id,int type,void *data,int datalen,
               char *additional_log_text)

{
  long lVar1;
  
  lVar1 = (**(code **)((cl[1].vt)->rportfwd_alloc + 0x18))(type);
  *(uint *)(lVar1 + 0x30) = id;
  *(char **)(lVar1 + 0x38) = additional_log_text;
  BinarySink_put_data((BinarySink *)(lVar1 + 0x60),data,(long)datalen);
  pq_base_push((PacketQueueBase *)cl[2].vt,(PacketQueueNode *)(lVar1 + 0x40));
  return;
}

Assistant:

static void ssh2_send_packet_from_downstream(
        ConnectionLayer *cl, unsigned id, int type,
        const void *data, int datalen, const char *additional_log_text)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    PktOut *pkt = ssh_bpp_new_pktout(s->ppl.bpp, type);
    pkt->downstream_id = id;
    pkt->additional_log_text = additional_log_text;
    put_data(pkt, data, datalen);
    pq_push(s->ppl.out_pq, pkt);
}